

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# comm.c
# Opt level: O0

int init_socket(int port)

{
  string_view fmt;
  string_view fmt_00;
  string_view fmt_01;
  string_view fmt_02;
  uint16_t uVar1;
  int __fd;
  int iVar2;
  int *piVar3;
  char *pcVar4;
  char **args;
  undefined4 in_EDI;
  int done;
  int fd;
  int x;
  sockaddr_in sa;
  char *in_stack_ffffffffffffff88;
  basic_string_view<char,_std::char_traits<char>_> *in_stack_ffffffffffffff90;
  char **in_stack_ffffffffffffffb0;
  CLogger *in_stack_ffffffffffffffb8;
  size_t in_stack_ffffffffffffffc0;
  char *in_stack_ffffffffffffffc8;
  int local_20;
  undefined4 local_18;
  undefined1 local_14 [16];
  undefined4 local_4;
  
  local_18 = 1;
  local_20 = 0;
  local_4 = in_EDI;
  while( true ) {
    __fd = socket(2,1,0);
    if (__fd < 0) {
      std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view
                (in_stack_ffffffffffffff90,in_stack_ffffffffffffff88);
      piVar3 = __errno_location();
      pcVar4 = strerror(*piVar3);
      fmt._M_str = pcVar4;
      fmt._M_len = in_stack_ffffffffffffffc0;
      CLogger::Error<char*>(in_stack_ffffffffffffffb8,fmt,in_stack_ffffffffffffffb0);
      exit(0);
    }
    iVar2 = setsockopt(__fd,1,2,&local_18,4);
    if (iVar2 < 0) {
      std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view
                (in_stack_ffffffffffffff90,in_stack_ffffffffffffff88);
      piVar3 = __errno_location();
      args = (char **)strerror(*piVar3);
      fmt_00._M_str = in_stack_ffffffffffffffc8;
      fmt_00._M_len = in_stack_ffffffffffffffc0;
      CLogger::Error<char*>(in_stack_ffffffffffffffb8,fmt_00,args);
      close(__fd);
      exit(0);
    }
    local_14[8] = init_socket::sa_zero.sin_zero[0];
    local_14[9] = init_socket::sa_zero.sin_zero[1];
    local_14[10] = init_socket::sa_zero.sin_zero[2];
    local_14[0xb] = init_socket::sa_zero.sin_zero[3];
    local_14[0xc] = init_socket::sa_zero.sin_zero[4];
    local_14[0xd] = init_socket::sa_zero.sin_zero[5];
    local_14[0xe] = init_socket::sa_zero.sin_zero[6];
    local_14[0xf] = init_socket::sa_zero.sin_zero[7];
    local_14._2_6_ = init_socket::sa_zero._2_6_;
    local_14._0_2_ = 2;
    uVar1 = htons((uint16_t)local_4);
    local_14._2_2_ = uVar1;
    iVar2 = bind(__fd,(sockaddr *)local_14,0x10);
    if (-1 < iVar2) {
      iVar2 = listen(__fd,3);
      if (iVar2 < 0) {
        std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view
                  (in_stack_ffffffffffffff90,in_stack_ffffffffffffff88);
        piVar3 = __errno_location();
        strerror(*piVar3);
        fmt_02._M_str = in_stack_ffffffffffffffc8;
        fmt_02._M_len = in_stack_ffffffffffffffc0;
        CLogger::Warn<char*>(in_stack_ffffffffffffffb8,fmt_02,in_stack_ffffffffffffffb0);
        close(__fd);
        exit(0);
      }
      return __fd;
    }
    std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view
              (in_stack_ffffffffffffff90,in_stack_ffffffffffffff88);
    piVar3 = __errno_location();
    strerror(*piVar3);
    fmt_01._M_str = in_stack_ffffffffffffffc8;
    fmt_01._M_len = in_stack_ffffffffffffffc0;
    CLogger::Warn<char*>(in_stack_ffffffffffffffb8,fmt_01,in_stack_ffffffffffffffb0);
    local_20 = local_20 + -1;
    if (local_20 < 0) break;
    sleep(10);
  }
  fprintf(_stderr,"Unable to allocate port.  Exiting.\n\r");
  close(__fd);
  exit(0);
}

Assistant:

int init_socket(int port)
{
	static struct sockaddr_in sa_zero;
	struct sockaddr_in sa;
	int x = 1;
	int fd;
	int done = 0;

BIND_AGAIN:

	if ((fd = socket(AF_INET, SOCK_STREAM, 0)) < 0)
	{
		RS.Logger.Error("Init_socket: socket: {}", std::strerror(errno));
		exit(0);
	}

	if (setsockopt(fd, SOL_SOCKET, SO_REUSEADDR, (char *)&x, sizeof(x)) < 0)
	{
		RS.Logger.Error("Init_socket: SO_REUSEADDR: {}", std::strerror(errno));
		close(fd);
		exit(0);
	}
	/*
	#ifdef SO_DONTLINGER
		{
		struct	linger	ld;

		ld.l_onoff  = 1;
		ld.l_linger = 1000;

		if ( setsockopt( fd, SOL_SOCKET, SO_DONTLINGER,
		(char *) &ld, sizeof(ld) ) < 0 )
		{
			RS.Logger.Error("Init_socket: SO_DONTLINGER: {}", std::strerror(errno));
			close(fd);
			exit( SAFE_EXIT );
		}
		}
	#endif
	*/
	sa = sa_zero;
	sa.sin_family = AF_INET;
	sa.sin_port = htons(port);

	if (bind(fd, (struct sockaddr *)&sa, sizeof(sa)) < 0)
	{
		RS.Logger.Warn("Init_socket: bind: {}", std::strerror(errno));
		if (--done < 0)
		{
			fprintf(stderr, "Unable to allocate port.  Exiting.\n\r");
			close(fd);
			exit(0);
		}
		else
		{
			sleep(10);
			goto BIND_AGAIN;
		}
	}

	if (listen(fd, 3) < 0)
	{
		RS.Logger.Warn("Init_socket: listen: {}", std::strerror(errno));
		close(fd);
		exit(0);
	}

	return fd;
}